

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O2

void __thiscall
ConfidentialTxIn_EstimateTxInVsize_Test::ConfidentialTxIn_EstimateTxInVsize_Test
          (ConfidentialTxIn_EstimateTxInVsize_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00707c20;
  return;
}

Assistant:

TEST(ConfidentialTxIn, EstimateTxInVsize) {
  static const std::string multisig_script = "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae";
  static const std::vector<TestEstimateConfidentialTxInSizeVector> test_vector = {
    {AddressType::kP2pkhAddress, 150, 0, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shAddress, 205, 0, exp_script, 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shP2wpkhAddress, 92, 0, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shP2wshAddress, 113, 0, Script("51"), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wpkhAddress, 69, 0, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wshAddress, 83, 0, exp_script, 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wshAddress, 106, 0, Script(multisig_script), 0, Script(), false, false, false, "", 0, 0, 0},
    // pegin
    {AddressType::kP2wpkhAddress, 252, 0, Script(), 226,
     Script("0014e8d28b573816ddfcf98578d7b28543e273f5a72a"), false, false, false, "", 0, 0, 400},
    // issue
    {AddressType::kP2wpkhAddress, 151, 0, Script(), 0, Script(), true, false, false, "", 0, 0, 0},
    {AddressType::kP2wpkhAddress, /*1645*/ 2253, 0, Script(), 0, Script(), true, true, false, "", 0, 36, 0},
    {AddressType::kP2wpkhAddress, 2285, 0, Script(), 0, Script(), true, true, false, "", 0, 52, 0},
    // reissue
    {AddressType::kP2wpkhAddress, /*922*/ 1226, 0, Script(), 0, Script(), true, true, true, "", 0, 36, 0},
    {AddressType::kP2wpkhAddress, 1242, 0, Script(), 0, Script(), true, true, true, "", 0, 52, 0},
  };

  for (const auto& test_data : test_vector) {
    uint32_t vsize = 0;
    Script script_template(test_data.script_template);
    Script* template_ptr = nullptr;
    if (!test_data.script_template.empty()) {
      template_ptr = &script_template;
    }
    EXPECT_NO_THROW((vsize = ConfidentialTxIn::EstimateTxInVsize(
        test_data.addr_type, test_data.redeem_script, test_data.pegin_btc_tx,
        test_data.claim_script, test_data.is_issuance, test_data.is_blind,
        test_data.is_reissuance, template_ptr,
        test_data.exponent, test_data.minimum_bits, nullptr,
        test_data.txoutproof_size)));
    EXPECT_EQ(vsize, test_data.size);
  }
}